

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

bool tcu::isValid(TextureFormat format)

{
  ChannelOrder CVar1;
  bool bVar2;
  bool bVar3;
  
  CVar1 = format.order;
  if (FLOAT_UNSIGNED_INT_24_8_REV < format.type) {
    return false;
  }
  switch((long)&switchD_005d7a9c::switchdataD_0068aae0 +
         (long)(int)(&switchD_005d7a9c::switchdataD_0068aae0)[(ulong)format >> 0x20]) {
  case 0x5d7a9e:
    bVar3 = CVar1 == RGBA;
    bVar2 = CVar1 == BGRA;
    goto LAB_005d7ac4;
  case 0x5d7aa9:
    return CVar1 < S;
  case 0x5d7aaf:
    return CVar1 < D;
  case 0x5d7ab0:
    bVar3 = CVar1 < D;
    bVar2 = CVar1 == S;
LAB_005d7ac4:
    return (bool)(bVar2 | bVar3);
  case 0x5d7abb:
    bVar3 = CVar1 == RGB;
    bVar2 = CVar1 == BGR;
    goto LAB_005d7ac4;
  case 0x5d7aca:
    bVar3 = CVar1 == RGB;
    break;
  case 0x5d7acf:
    bVar3 = CVar1 == DS;
    break;
  case 0x5d7ad4:
    bVar3 = CVar1 == RG;
    break;
  case 0x5d7ad9:
    bVar3 = (CVar1 - D & 0xfffffffd) == 0;
    break;
  case 0x5d7ae3:
    bVar3 = CVar1 == ARGB;
  }
  return bVar3;
}

Assistant:

bool isValid (TextureFormat format)
{
	const bool	isColor	= isColorOrder(format.order);

	switch (format.type)
	{
		case TextureFormat::SNORM_INT8:
		case TextureFormat::SNORM_INT16:
		case TextureFormat::SNORM_INT32:
			return isColor;

		case TextureFormat::UNORM_INT8:
		case TextureFormat::UNORM_INT16:
		case TextureFormat::UNORM_INT24:
		case TextureFormat::UNORM_INT32:
			return isColor || format.order == TextureFormat::D;

		case TextureFormat::UNORM_BYTE_44:
		case TextureFormat::UNSIGNED_BYTE_44:
			return format.order == TextureFormat::RG;

		case TextureFormat::UNORM_SHORT_565:
		case TextureFormat::UNORM_SHORT_555:
		case TextureFormat::UNSIGNED_SHORT_565:
			return format.order == TextureFormat::RGB || format.order == TextureFormat::BGR;

		case TextureFormat::UNORM_SHORT_4444:
		case TextureFormat::UNORM_SHORT_5551:
		case TextureFormat::UNSIGNED_SHORT_4444:
		case TextureFormat::UNSIGNED_SHORT_5551:
			return format.order == TextureFormat::RGBA || format.order == TextureFormat::BGRA;

		case TextureFormat::UNORM_SHORT_1555:
			return format.order == TextureFormat::ARGB;

		case TextureFormat::UNORM_INT_101010:
			return format.order == TextureFormat::RGB;

		case TextureFormat::SNORM_INT_1010102_REV:
		case TextureFormat::UNORM_INT_1010102_REV:
		case TextureFormat::SIGNED_INT_1010102_REV:
		case TextureFormat::UNSIGNED_INT_1010102_REV:
			return format.order == TextureFormat::RGBA || format.order == TextureFormat::BGRA;

		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:
		case TextureFormat::UNSIGNED_INT_999_E5_REV:
			return format.order == TextureFormat::RGB;

		case TextureFormat::UNSIGNED_INT_16_8_8:
			return format.order == TextureFormat::DS;

		case TextureFormat::UNSIGNED_INT_24_8:
		case TextureFormat::UNSIGNED_INT_24_8_REV:
			return format.order == TextureFormat::D || format.order == TextureFormat::DS;

		case TextureFormat::SIGNED_INT8:
		case TextureFormat::SIGNED_INT16:
		case TextureFormat::SIGNED_INT32:
			return isColor;

		case TextureFormat::UNSIGNED_INT8:
		case TextureFormat::UNSIGNED_INT16:
		case TextureFormat::UNSIGNED_INT24:
		case TextureFormat::UNSIGNED_INT32:
			return isColor || format.order == TextureFormat::S;

		case TextureFormat::HALF_FLOAT:
		case TextureFormat::FLOAT:
		case TextureFormat::FLOAT64:
			return isColor || format.order == TextureFormat::D;

		case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:
			return format.order == TextureFormat::DS;

		default:
			DE_FATAL("Unknown format");
			return 0u;
	}

	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);
}